

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O3

char * IoTHubAccount_GetEventhubAccessKey(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  int iVar1;
  STRING_HANDLE handle;
  STRING_TOKENIZER_HANDLE_conflict tokenizer;
  STRING_HANDLE output;
  STRING_HANDLE handle_00;
  char *pcVar2;
  undefined1 auVar3 [16];
  char tokenValue [128];
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  
  if ((acctHandle != (IOTHUB_ACCOUNT_INFO_HANDLE)0x0) && (acctHandle->connString != (char *)0x0)) {
    handle = STRING_construct(acctHandle->connString);
    if (handle != (STRING_HANDLE)0x0) {
      tokenizer = STRING_TOKENIZER_create(handle);
      if (tokenizer != (STRING_TOKENIZER_HANDLE_conflict)0x0) {
        output = STRING_new();
        if (output != (STRING_HANDLE)0x0) {
          handle_00 = STRING_new();
          if (handle_00 != (STRING_HANDLE)0x0) {
            iVar1 = STRING_TOKENIZER_get_next_token(tokenizer,output,"=");
            while (iVar1 == 0) {
              pcVar2 = STRING_c_str(output);
              strcpy(&local_b8,pcVar2);
              iVar1 = STRING_TOKENIZER_get_next_token(tokenizer,output,";");
              if (iVar1 != 0) break;
              auVar3[0] = -(local_b8 == 'S');
              auVar3[1] = -(cStack_b7 == 'h');
              auVar3[2] = -(cStack_b6 == 'a');
              auVar3[3] = -(cStack_b5 == 'r');
              auVar3[4] = -(cStack_b4 == 'e');
              auVar3[5] = -(cStack_b3 == 'd');
              auVar3[6] = -(cStack_b2 == 'A');
              auVar3[7] = -(cStack_b1 == 'c');
              auVar3[8] = -(cStack_b0 == 'c');
              auVar3[9] = -(cStack_af == 'e');
              auVar3[10] = -(cStack_ae == 's');
              auVar3[0xb] = -(cStack_ad == 's');
              auVar3[0xc] = -(cStack_ac == 'K');
              auVar3[0xd] = -(cStack_ab == 'e');
              auVar3[0xe] = -(cStack_aa == 'y');
              auVar3[0xf] = -(cStack_a9 == '\0');
              if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
                pcVar2 = STRING_c_str(output);
                strcpy(IoTHubAccount_GetEventhubAccessKey::access_key,pcVar2);
                break;
              }
              iVar1 = STRING_TOKENIZER_get_next_token(tokenizer,output,"=");
            }
            STRING_delete(handle_00);
          }
          STRING_delete(output);
        }
        STRING_TOKENIZER_destroy(tokenizer);
      }
      STRING_delete(handle);
    }
  }
  return IoTHubAccount_GetEventhubAccessKey::access_key;
}

Assistant:

const char* IoTHubAccount_GetEventhubAccessKey(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    const char *iothub_connection_string;
    static char access_key[128];

    if ((iothub_connection_string = IoTHubAccount_GetIoTHubConnString(acctHandle)) != NULL)
    {
        STRING_HANDLE iothub_connection_string_str;

        if ((iothub_connection_string_str = STRING_construct(iothub_connection_string)) != NULL)
        {
            STRING_TOKENIZER_HANDLE tokenizer;

            if ((tokenizer = STRING_TOKENIZER_create(iothub_connection_string_str)) != NULL)
            {
                STRING_HANDLE tokenString;

                if ((tokenString = STRING_new()) != NULL)
                {
                    STRING_HANDLE valueString;

                    if ((valueString = STRING_new()) != NULL)
                    {
                        while ((STRING_TOKENIZER_get_next_token(tokenizer, tokenString, "=") == 0))
                        {
                            char tokenValue[128];
                            strcpy(tokenValue, STRING_c_str(tokenString));

                            if (STRING_TOKENIZER_get_next_token(tokenizer, tokenString, ";") != 0)
                            {
                                break;
                            }

                            if (strcmp(tokenValue, "SharedAccessKey") == 0)
                            {
                                strcpy(access_key, STRING_c_str(tokenString));
                                break;
                            }
                        }

                        STRING_delete(valueString);
                    }

                    STRING_delete(tokenString);
                }

                STRING_TOKENIZER_destroy(tokenizer);
            }

            STRING_delete(iothub_connection_string_str);
        }
    }

    return access_key;
}